

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QVariant * __thiscall QMap<int,_QVariant>::operator[](QMap<int,_QVariant> *this,int *key)

{
  bool bVar1;
  pointer ppVar2;
  pair<const_int,_QVariant> *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QVariant>_>,_bool> pVar3;
  iterator i;
  QMap<int,_QVariant> copy;
  map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>
  *in_stack_ffffffffffffff38;
  QVariant *pQVar4;
  QMap<int,_QVariant> *in_stack_ffffffffffffff40;
  map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_> *this_00;
  _Self local_78;
  _Self local_70;
  undefined1 *local_68;
  _Base_ptr local_60;
  undefined1 local_58;
  map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_> local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff40->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff40,(QMap<int,_QVariant> *)in_stack_ffffffffffffff38);
  }
  else {
    memset(&local_68,0,8);
    QMap((QMap<int,_QVariant> *)0x996a13);
  }
  detach(in_stack_ffffffffffffff40);
  local_70._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                *)0x996a33);
  local_70._M_node =
       (_Base_ptr)
       std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>::
       find(in_stack_ffffffffffffff38,(key_type *)0x996a44);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                *)0x996a53);
  local_78._M_node =
       (_Base_ptr)
       std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>::
       end(in_stack_ffffffffffffff38);
  bVar1 = std::operator==(&local_70,&local_78);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                  *)0x996a86);
    this_00 = &local_50;
    ::QVariant::QVariant((QVariant *)0x996aa8);
    std::pair<const_int,_QVariant>::pair<QVariant,_true>
              (in_RSI,(int *)in_stack_ffffffffffffff38,(QVariant *)0x996ac4);
    pVar3 = std::
            map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>::
            insert(this_00,in_RSI);
    local_70._M_node = (_Base_ptr)pVar3.first._M_node;
    local_58 = pVar3.second;
    local_60 = local_70._M_node;
    std::pair<const_int,_QVariant>::~pair((pair<const_int,_QVariant> *)0x996b05);
    ::QVariant::~QVariant((QVariant *)&local_50);
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_QVariant>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_QVariant>_> *)0x996b19);
  pQVar4 = &ppVar2->second;
  ~QMap((QMap<int,_QVariant> *)0x996b2b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }